

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool __thiscall QMainWindowLayoutState::fits(QMainWindowLayoutState *this)

{
  QWidgetData *pQVar1;
  bool bVar2;
  QSize QVar3;
  
  QVar3 = QDockAreaLayout::minimumStableSize(&this->dockAreaLayout);
  pQVar1 = (this->mainWindow->super_QWidget).data;
  if (((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1 <
      (((this->toolBarAreaLayout).docks[0].rect.x2.m_i + QVar3.wd.m_i.m_i +
       (this->toolBarAreaLayout).docks[1].rect.x2.m_i) -
      ((this->toolBarAreaLayout).docks[0].rect.x1.m_i +
      (this->toolBarAreaLayout).docks[1].rect.x1.m_i)) + 2) {
    bVar2 = false;
  }
  else {
    bVar2 = ((QVar3.ht.m_i.m_i + (this->toolBarAreaLayout).docks[2].rect.y2.m_i +
             (this->toolBarAreaLayout).docks[3].rect.y2.m_i) -
            ((this->toolBarAreaLayout).docks[2].rect.y1.m_i +
            (this->toolBarAreaLayout).docks[3].rect.y1.m_i)) + 2 <=
            ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
  }
  return bVar2;
}

Assistant:

bool QMainWindowLayoutState::fits() const
{
    Q_ASSERT(mainWindow);

    QSize size;

#if QT_CONFIG(dockwidget)
    size = dockAreaLayout.minimumStableSize();
#endif

#if QT_CONFIG(toolbar)
    size.rwidth() += toolBarAreaLayout.docks[QInternal::LeftDock].rect.width();
    size.rwidth() += toolBarAreaLayout.docks[QInternal::RightDock].rect.width();
    size.rheight() += toolBarAreaLayout.docks[QInternal::TopDock].rect.height();
    size.rheight() += toolBarAreaLayout.docks[QInternal::BottomDock].rect.height();
#endif

    return size.width() <= mainWindow->width() && size.height() <= mainWindow->height();
}